

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# knucleotide.cc
# Opt level: O1

void WriteFrequencies<2u>(Data *input)

{
  _Rb_tree_header *p_Var1;
  char cVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  int iVar7;
  int iVar8;
  int iVar9;
  int iVar10;
  undefined1 auVar11 [11];
  undefined1 auVar12 [11];
  undefined1 auVar13 [12];
  undefined1 auVar14 [12];
  undefined1 auVar15 [13];
  undefined1 auVar16 [13];
  undefined1 auVar17 [14];
  undefined1 auVar18 [14];
  ostream *poVar19;
  _Base_ptr p_Var20;
  uint uVar21;
  char *pcVar22;
  uint uVar23;
  slot_type *this;
  double dVar24;
  char in_XMM1_Ba;
  char in_XMM1_Bb;
  char in_XMM1_Bc;
  char in_XMM1_Bd;
  char in_XMM1_Be;
  char in_XMM1_Bf;
  char in_XMM1_Bg;
  char in_XMM1_Bh;
  char in_XMM1_Bi;
  char in_XMM1_Bj;
  char in_XMM1_Bk;
  char in_XMM1_Bl;
  char in_XMM1_Bm;
  char in_XMM1_Bn;
  char in_XMM1_Bo;
  byte in_XMM1_Bp;
  map<unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::greater<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  freq;
  pair<const_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_b8;
  _Rb_tree<unsigned_int,_std::pair<const_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::greater<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_90;
  raw_hash_set<phmap::priv::FlatHashMapPolicy<Key<2UL>,_unsigned_int>,_Key<2UL>::Hash,_phmap::EqualTo<Key<2UL>_>,_std::allocator<std::pair<const_Key<2UL>,_unsigned_int>_>_>
  local_60;
  
  CalculateInThreads<2ul>((HashTable<1UL> *)&local_60,input);
  local_90._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_90._M_impl.super__Rb_tree_header._M_header;
  local_90._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_90._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_90._M_impl.super__Rb_tree_header._M_node_count = 0;
  cVar2 = *local_60.ctrl_;
  pcVar22 = local_60.ctrl_;
  this = local_60.slots_;
  while (cVar2 < -1) {
    iVar7 = -(uint)(CONCAT13(in_XMM1_Bd,CONCAT12(in_XMM1_Bc,CONCAT11(in_XMM1_Bb,in_XMM1_Ba))) ==
                   CONCAT13(in_XMM1_Bd,CONCAT12(in_XMM1_Bc,CONCAT11(in_XMM1_Bb,in_XMM1_Ba))));
    iVar8 = -(uint)(CONCAT13(in_XMM1_Bh,CONCAT12(in_XMM1_Bg,CONCAT11(in_XMM1_Bf,in_XMM1_Be))) ==
                   CONCAT13(in_XMM1_Bh,CONCAT12(in_XMM1_Bg,CONCAT11(in_XMM1_Bf,in_XMM1_Be))));
    iVar9 = -(uint)(CONCAT13(in_XMM1_Bl,CONCAT12(in_XMM1_Bk,CONCAT11(in_XMM1_Bj,in_XMM1_Bi))) ==
                   CONCAT13(in_XMM1_Bl,CONCAT12(in_XMM1_Bk,CONCAT11(in_XMM1_Bj,in_XMM1_Bi))));
    iVar10 = -(uint)(CONCAT13(in_XMM1_Bp,CONCAT12(in_XMM1_Bo,CONCAT11(in_XMM1_Bn,in_XMM1_Bm))) ==
                    CONCAT13(in_XMM1_Bp,CONCAT12(in_XMM1_Bo,CONCAT11(in_XMM1_Bn,in_XMM1_Bm))));
    in_XMM1_Ba = -(*pcVar22 < (char)iVar7);
    in_XMM1_Bb = -(pcVar22[1] < (char)((uint)iVar7 >> 8));
    in_XMM1_Bc = -(pcVar22[2] < (char)((uint)iVar7 >> 0x10));
    in_XMM1_Bd = -(pcVar22[3] < (char)((uint)iVar7 >> 0x18));
    in_XMM1_Be = -(pcVar22[4] < (char)iVar8);
    in_XMM1_Bf = -(pcVar22[5] < (char)((uint)iVar8 >> 8));
    in_XMM1_Bg = -(pcVar22[6] < (char)((uint)iVar8 >> 0x10));
    in_XMM1_Bh = -(pcVar22[7] < (char)((uint)iVar8 >> 0x18));
    in_XMM1_Bi = -(pcVar22[8] < (char)iVar9);
    in_XMM1_Bj = -(pcVar22[9] < (char)((uint)iVar9 >> 8));
    in_XMM1_Bk = -(pcVar22[10] < (char)((uint)iVar9 >> 0x10));
    in_XMM1_Bl = -(pcVar22[0xb] < (char)((uint)iVar9 >> 0x18));
    in_XMM1_Bm = -(pcVar22[0xc] < (char)iVar10);
    in_XMM1_Bn = -(pcVar22[0xd] < (char)((uint)iVar10 >> 8));
    in_XMM1_Bo = -(pcVar22[0xe] < (char)((uint)iVar10 >> 0x10));
    in_XMM1_Bp = -(pcVar22[0xf] < (char)((uint)iVar10 >> 0x18));
    auVar3[1] = in_XMM1_Bb;
    auVar3[0] = in_XMM1_Ba;
    auVar3[2] = in_XMM1_Bc;
    auVar3[3] = in_XMM1_Bd;
    auVar3[4] = in_XMM1_Be;
    auVar3[5] = in_XMM1_Bf;
    auVar3[6] = in_XMM1_Bg;
    auVar3[7] = in_XMM1_Bh;
    auVar3[8] = in_XMM1_Bi;
    auVar3[9] = in_XMM1_Bj;
    auVar3[10] = in_XMM1_Bk;
    auVar3[0xb] = in_XMM1_Bl;
    auVar3[0xc] = in_XMM1_Bm;
    auVar3[0xd] = in_XMM1_Bn;
    auVar3[0xe] = in_XMM1_Bo;
    auVar3[0xf] = in_XMM1_Bp;
    auVar4[1] = in_XMM1_Bb;
    auVar4[0] = in_XMM1_Ba;
    auVar4[2] = in_XMM1_Bc;
    auVar4[3] = in_XMM1_Bd;
    auVar4[4] = in_XMM1_Be;
    auVar4[5] = in_XMM1_Bf;
    auVar4[6] = in_XMM1_Bg;
    auVar4[7] = in_XMM1_Bh;
    auVar4[8] = in_XMM1_Bi;
    auVar4[9] = in_XMM1_Bj;
    auVar4[10] = in_XMM1_Bk;
    auVar4[0xb] = in_XMM1_Bl;
    auVar4[0xc] = in_XMM1_Bm;
    auVar4[0xd] = in_XMM1_Bn;
    auVar4[0xe] = in_XMM1_Bo;
    auVar4[0xf] = in_XMM1_Bp;
    auVar17[1] = in_XMM1_Bd;
    auVar17[0] = in_XMM1_Bc;
    auVar17[2] = in_XMM1_Be;
    auVar17[3] = in_XMM1_Bf;
    auVar17[4] = in_XMM1_Bg;
    auVar17[5] = in_XMM1_Bh;
    auVar17[6] = in_XMM1_Bi;
    auVar17[7] = in_XMM1_Bj;
    auVar17[8] = in_XMM1_Bk;
    auVar17[9] = in_XMM1_Bl;
    auVar17[10] = in_XMM1_Bm;
    auVar17[0xb] = in_XMM1_Bn;
    auVar17[0xc] = in_XMM1_Bo;
    auVar17[0xd] = in_XMM1_Bp;
    auVar15[1] = in_XMM1_Be;
    auVar15[0] = in_XMM1_Bd;
    auVar15[2] = in_XMM1_Bf;
    auVar15[3] = in_XMM1_Bg;
    auVar15[4] = in_XMM1_Bh;
    auVar15[5] = in_XMM1_Bi;
    auVar15[6] = in_XMM1_Bj;
    auVar15[7] = in_XMM1_Bk;
    auVar15[8] = in_XMM1_Bl;
    auVar15[9] = in_XMM1_Bm;
    auVar15[10] = in_XMM1_Bn;
    auVar15[0xb] = in_XMM1_Bo;
    auVar15[0xc] = in_XMM1_Bp;
    auVar13[1] = in_XMM1_Bf;
    auVar13[0] = in_XMM1_Be;
    auVar13[2] = in_XMM1_Bg;
    auVar13[3] = in_XMM1_Bh;
    auVar13[4] = in_XMM1_Bi;
    auVar13[5] = in_XMM1_Bj;
    auVar13[6] = in_XMM1_Bk;
    auVar13[7] = in_XMM1_Bl;
    auVar13[8] = in_XMM1_Bm;
    auVar13[9] = in_XMM1_Bn;
    auVar13[10] = in_XMM1_Bo;
    auVar13[0xb] = in_XMM1_Bp;
    auVar11[1] = in_XMM1_Bg;
    auVar11[0] = in_XMM1_Bf;
    auVar11[2] = in_XMM1_Bh;
    auVar11[3] = in_XMM1_Bi;
    auVar11[4] = in_XMM1_Bj;
    auVar11[5] = in_XMM1_Bk;
    auVar11[6] = in_XMM1_Bl;
    auVar11[7] = in_XMM1_Bm;
    auVar11[8] = in_XMM1_Bn;
    auVar11[9] = in_XMM1_Bo;
    auVar11[10] = in_XMM1_Bp;
    uVar21 = (ushort)((ushort)(SUB161(auVar3 >> 7,0) & 1) |
                      (ushort)(SUB161(auVar4 >> 0xf,0) & 1) << 1 |
                      (ushort)(SUB141(auVar17 >> 7,0) & 1) << 2 |
                      (ushort)(SUB131(auVar15 >> 7,0) & 1) << 3 |
                      (ushort)(SUB121(auVar13 >> 7,0) & 1) << 4 |
                      (ushort)(SUB111(auVar11 >> 7,0) & 1) << 5 |
                      (ushort)((byte)(CONCAT19(in_XMM1_Bp,
                                               CONCAT18(in_XMM1_Bo,
                                                        CONCAT17(in_XMM1_Bn,
                                                                 CONCAT16(in_XMM1_Bm,
                                                                          CONCAT15(in_XMM1_Bl,
                                                                                   CONCAT14(
                                                  in_XMM1_Bk,
                                                  CONCAT13(in_XMM1_Bj,
                                                           CONCAT12(in_XMM1_Bi,
                                                                    CONCAT11(in_XMM1_Bh,in_XMM1_Bg))
                                                          ))))))) >> 7) & 1) << 6 |
                      (ushort)((byte)(CONCAT18(in_XMM1_Bp,
                                               CONCAT17(in_XMM1_Bo,
                                                        CONCAT16(in_XMM1_Bn,
                                                                 CONCAT15(in_XMM1_Bm,
                                                                          CONCAT14(in_XMM1_Bl,
                                                                                   CONCAT13(
                                                  in_XMM1_Bk,
                                                  CONCAT12(in_XMM1_Bj,
                                                           CONCAT11(in_XMM1_Bi,in_XMM1_Bh)))))))) >>
                                     7) & 1) << 7 | (ushort)(in_XMM1_Bp >> 7) << 0xf) + 1;
    uVar23 = 0;
    if (uVar21 != 0) {
      for (; (uVar21 >> uVar23 & 1) == 0; uVar23 = uVar23 + 1) {
      }
    }
    this = this + uVar23;
    cVar2 = pcVar22[uVar23];
    pcVar22 = pcVar22 + uVar23;
  }
  local_90._M_impl.super__Rb_tree_header._M_header._M_right =
       local_90._M_impl.super__Rb_tree_header._M_header._M_left;
  if (pcVar22 != local_60.ctrl_ + local_60.capacity_) {
    do {
      local_b8.first = (this->value).second;
      Key::operator_cast_to_string(&local_b8.second,(Key *)&this->value);
      std::
      _Rb_tree<unsigned_int,std::pair<unsigned_int_const,std::__cxx11::string>,std::_Select1st<std::pair<unsigned_int_const,std::__cxx11::string>>,std::greater<unsigned_int>,std::allocator<std::pair<unsigned_int_const,std::__cxx11::string>>>
      ::_M_insert_unique<std::pair<unsigned_int_const,std::__cxx11::string>>
                ((_Rb_tree<unsigned_int,std::pair<unsigned_int_const,std::__cxx11::string>,std::_Select1st<std::pair<unsigned_int_const,std::__cxx11::string>>,std::greater<unsigned_int>,std::allocator<std::pair<unsigned_int_const,std::__cxx11::string>>>
                  *)&local_90,&local_b8);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_b8.second._M_dataplus._M_p != &local_b8.second.field_2) {
        operator_delete(local_b8.second._M_dataplus._M_p);
      }
      this = this + 1;
      cVar2 = pcVar22[1];
      pcVar22 = pcVar22 + 1;
      while (cVar2 < -1) {
        iVar7 = -(uint)(CONCAT13(in_XMM1_Bd,CONCAT12(in_XMM1_Bc,CONCAT11(in_XMM1_Bb,in_XMM1_Ba))) ==
                       CONCAT13(in_XMM1_Bd,CONCAT12(in_XMM1_Bc,CONCAT11(in_XMM1_Bb,in_XMM1_Ba))));
        iVar8 = -(uint)(CONCAT13(in_XMM1_Bh,CONCAT12(in_XMM1_Bg,CONCAT11(in_XMM1_Bf,in_XMM1_Be))) ==
                       CONCAT13(in_XMM1_Bh,CONCAT12(in_XMM1_Bg,CONCAT11(in_XMM1_Bf,in_XMM1_Be))));
        iVar9 = -(uint)(CONCAT13(in_XMM1_Bl,CONCAT12(in_XMM1_Bk,CONCAT11(in_XMM1_Bj,in_XMM1_Bi))) ==
                       CONCAT13(in_XMM1_Bl,CONCAT12(in_XMM1_Bk,CONCAT11(in_XMM1_Bj,in_XMM1_Bi))));
        iVar10 = -(uint)(CONCAT13(in_XMM1_Bp,CONCAT12(in_XMM1_Bo,CONCAT11(in_XMM1_Bn,in_XMM1_Bm)))
                        == CONCAT13(in_XMM1_Bp,CONCAT12(in_XMM1_Bo,CONCAT11(in_XMM1_Bn,in_XMM1_Bm)))
                        );
        in_XMM1_Ba = -(*pcVar22 < (char)iVar7);
        in_XMM1_Bb = -(pcVar22[1] < (char)((uint)iVar7 >> 8));
        in_XMM1_Bc = -(pcVar22[2] < (char)((uint)iVar7 >> 0x10));
        in_XMM1_Bd = -(pcVar22[3] < (char)((uint)iVar7 >> 0x18));
        in_XMM1_Be = -(pcVar22[4] < (char)iVar8);
        in_XMM1_Bf = -(pcVar22[5] < (char)((uint)iVar8 >> 8));
        in_XMM1_Bg = -(pcVar22[6] < (char)((uint)iVar8 >> 0x10));
        in_XMM1_Bh = -(pcVar22[7] < (char)((uint)iVar8 >> 0x18));
        in_XMM1_Bi = -(pcVar22[8] < (char)iVar9);
        in_XMM1_Bj = -(pcVar22[9] < (char)((uint)iVar9 >> 8));
        in_XMM1_Bk = -(pcVar22[10] < (char)((uint)iVar9 >> 0x10));
        in_XMM1_Bl = -(pcVar22[0xb] < (char)((uint)iVar9 >> 0x18));
        in_XMM1_Bm = -(pcVar22[0xc] < (char)iVar10);
        in_XMM1_Bn = -(pcVar22[0xd] < (char)((uint)iVar10 >> 8));
        in_XMM1_Bo = -(pcVar22[0xe] < (char)((uint)iVar10 >> 0x10));
        in_XMM1_Bp = -(pcVar22[0xf] < (char)((uint)iVar10 >> 0x18));
        auVar5[1] = in_XMM1_Bb;
        auVar5[0] = in_XMM1_Ba;
        auVar5[2] = in_XMM1_Bc;
        auVar5[3] = in_XMM1_Bd;
        auVar5[4] = in_XMM1_Be;
        auVar5[5] = in_XMM1_Bf;
        auVar5[6] = in_XMM1_Bg;
        auVar5[7] = in_XMM1_Bh;
        auVar5[8] = in_XMM1_Bi;
        auVar5[9] = in_XMM1_Bj;
        auVar5[10] = in_XMM1_Bk;
        auVar5[0xb] = in_XMM1_Bl;
        auVar5[0xc] = in_XMM1_Bm;
        auVar5[0xd] = in_XMM1_Bn;
        auVar5[0xe] = in_XMM1_Bo;
        auVar5[0xf] = in_XMM1_Bp;
        auVar6[1] = in_XMM1_Bb;
        auVar6[0] = in_XMM1_Ba;
        auVar6[2] = in_XMM1_Bc;
        auVar6[3] = in_XMM1_Bd;
        auVar6[4] = in_XMM1_Be;
        auVar6[5] = in_XMM1_Bf;
        auVar6[6] = in_XMM1_Bg;
        auVar6[7] = in_XMM1_Bh;
        auVar6[8] = in_XMM1_Bi;
        auVar6[9] = in_XMM1_Bj;
        auVar6[10] = in_XMM1_Bk;
        auVar6[0xb] = in_XMM1_Bl;
        auVar6[0xc] = in_XMM1_Bm;
        auVar6[0xd] = in_XMM1_Bn;
        auVar6[0xe] = in_XMM1_Bo;
        auVar6[0xf] = in_XMM1_Bp;
        auVar18[1] = in_XMM1_Bd;
        auVar18[0] = in_XMM1_Bc;
        auVar18[2] = in_XMM1_Be;
        auVar18[3] = in_XMM1_Bf;
        auVar18[4] = in_XMM1_Bg;
        auVar18[5] = in_XMM1_Bh;
        auVar18[6] = in_XMM1_Bi;
        auVar18[7] = in_XMM1_Bj;
        auVar18[8] = in_XMM1_Bk;
        auVar18[9] = in_XMM1_Bl;
        auVar18[10] = in_XMM1_Bm;
        auVar18[0xb] = in_XMM1_Bn;
        auVar18[0xc] = in_XMM1_Bo;
        auVar18[0xd] = in_XMM1_Bp;
        auVar16[1] = in_XMM1_Be;
        auVar16[0] = in_XMM1_Bd;
        auVar16[2] = in_XMM1_Bf;
        auVar16[3] = in_XMM1_Bg;
        auVar16[4] = in_XMM1_Bh;
        auVar16[5] = in_XMM1_Bi;
        auVar16[6] = in_XMM1_Bj;
        auVar16[7] = in_XMM1_Bk;
        auVar16[8] = in_XMM1_Bl;
        auVar16[9] = in_XMM1_Bm;
        auVar16[10] = in_XMM1_Bn;
        auVar16[0xb] = in_XMM1_Bo;
        auVar16[0xc] = in_XMM1_Bp;
        auVar14[1] = in_XMM1_Bf;
        auVar14[0] = in_XMM1_Be;
        auVar14[2] = in_XMM1_Bg;
        auVar14[3] = in_XMM1_Bh;
        auVar14[4] = in_XMM1_Bi;
        auVar14[5] = in_XMM1_Bj;
        auVar14[6] = in_XMM1_Bk;
        auVar14[7] = in_XMM1_Bl;
        auVar14[8] = in_XMM1_Bm;
        auVar14[9] = in_XMM1_Bn;
        auVar14[10] = in_XMM1_Bo;
        auVar14[0xb] = in_XMM1_Bp;
        auVar12[1] = in_XMM1_Bg;
        auVar12[0] = in_XMM1_Bf;
        auVar12[2] = in_XMM1_Bh;
        auVar12[3] = in_XMM1_Bi;
        auVar12[4] = in_XMM1_Bj;
        auVar12[5] = in_XMM1_Bk;
        auVar12[6] = in_XMM1_Bl;
        auVar12[7] = in_XMM1_Bm;
        auVar12[8] = in_XMM1_Bn;
        auVar12[9] = in_XMM1_Bo;
        auVar12[10] = in_XMM1_Bp;
        uVar21 = (ushort)((ushort)(SUB161(auVar5 >> 7,0) & 1) |
                          (ushort)(SUB161(auVar6 >> 0xf,0) & 1) << 1 |
                          (ushort)(SUB141(auVar18 >> 7,0) & 1) << 2 |
                          (ushort)(SUB131(auVar16 >> 7,0) & 1) << 3 |
                          (ushort)(SUB121(auVar14 >> 7,0) & 1) << 4 |
                          (ushort)(SUB111(auVar12 >> 7,0) & 1) << 5 |
                          (ushort)((byte)(CONCAT19(in_XMM1_Bp,
                                                   CONCAT18(in_XMM1_Bo,
                                                            CONCAT17(in_XMM1_Bn,
                                                                     CONCAT16(in_XMM1_Bm,
                                                                              CONCAT15(in_XMM1_Bl,
                                                                                       CONCAT14(
                                                  in_XMM1_Bk,
                                                  CONCAT13(in_XMM1_Bj,
                                                           CONCAT12(in_XMM1_Bi,
                                                                    CONCAT11(in_XMM1_Bh,in_XMM1_Bg))
                                                          ))))))) >> 7) & 1) << 6 |
                          (ushort)((byte)(CONCAT18(in_XMM1_Bp,
                                                   CONCAT17(in_XMM1_Bo,
                                                            CONCAT16(in_XMM1_Bn,
                                                                     CONCAT15(in_XMM1_Bm,
                                                                              CONCAT14(in_XMM1_Bl,
                                                                                       CONCAT13(
                                                  in_XMM1_Bk,
                                                  CONCAT12(in_XMM1_Bj,
                                                           CONCAT11(in_XMM1_Bi,in_XMM1_Bh)))))))) >>
                                         7) & 1) << 7 | (ushort)(in_XMM1_Bp >> 7) << 0xf) + 1;
        uVar23 = 0;
        if (uVar21 != 0) {
          for (; (uVar21 >> uVar23 & 1) == 0; uVar23 = uVar23 + 1) {
          }
        }
        this = this + uVar23;
        cVar2 = pcVar22[uVar23];
        pcVar22 = pcVar22 + uVar23;
      }
    } while (pcVar22 != local_60.ctrl_ + local_60.capacity_);
  }
  p_Var1 = &local_90._M_impl.super__Rb_tree_header;
  if ((_Rb_tree_header *)local_90._M_impl.super__Rb_tree_header._M_header._M_left != p_Var1) {
    uVar23 = ~*(uint *)&(input->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
                        _M_impl.super__Vector_impl_data._M_start +
             *(int *)&(input->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
                      _M_impl.super__Vector_impl_data._M_finish;
    p_Var20 = local_90._M_impl.super__Rb_tree_header._M_header._M_left;
    do {
      poVar19 = std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)&std::cout,(char *)p_Var20[1]._M_parent,
                           (long)p_Var20[1]._M_left);
      local_b8.first._0_1_ = 0x20;
      std::__ostream_insert<char,std::char_traits<char>>(poVar19,(char *)&local_b8,1);
      if (uVar23 == 0) {
        dVar24 = 0.0;
      }
      else {
        dVar24 = (double)(p_Var20[1]._M_color * 100) / (double)uVar23;
      }
      poVar19 = std::ostream::_M_insert<double>(dVar24);
      local_b8.first = CONCAT31(local_b8.first._1_3_,10);
      std::__ostream_insert<char,std::char_traits<char>>(poVar19,(char *)&local_b8,1);
      p_Var20 = (_Base_ptr)std::_Rb_tree_increment(p_Var20);
    } while ((_Rb_tree_header *)p_Var20 != p_Var1);
  }
  local_b8.first = CONCAT31(local_b8.first._1_3_,10);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,(char *)&local_b8,1);
  std::
  _Rb_tree<unsigned_int,_std::pair<const_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::greater<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~_Rb_tree(&local_90);
  phmap::priv::
  raw_hash_set<phmap::priv::FlatHashMapPolicy<Key<2UL>,_unsigned_int>,_Key<2UL>::Hash,_phmap::EqualTo<Key<2UL>_>,_std::allocator<std::pair<const_Key<2UL>,_unsigned_int>_>_>
  ::destroy_slots(&local_60);
  return;
}

Assistant:

void WriteFrequencies(const Cfg::Data& input)
{
    // we "receive" the returned object by move instead of copy.
    auto&& frequencies = CalculateInThreads<size>(input);
    std::map<unsigned, std::string, std::greater<unsigned>> freq;
    for(const auto& i: frequencies)
        freq.insert({i.second, i.first});

    const unsigned sum = static_cast<unsigned>(input.size()) + 1 - size;
    for(const auto& i : freq)
        std::cout << i.second << ' ' << (sum ? double(100 * i.first) / sum : 0.0) << '\n';
    std::cout << '\n';
}